

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode Curl_vsetopt(Curl_easy *data,CURLoption option,__va_list_tag *param)

{
  uint uVar1;
  CURLcode CVar2;
  undefined8 *local_f0;
  curl_off_t *local_c8;
  undefined8 *local_a0;
  undefined8 *local_78;
  long *local_50;
  __va_list_tag *param_local;
  CURLoption option_local;
  Curl_easy *data_local;
  
  if (option < 10000) {
    uVar1 = param->gp_offset;
    if (uVar1 < 0x29) {
      local_50 = (long *)((long)(int)uVar1 + (long)param->reg_save_area);
      param->gp_offset = uVar1 + 8;
    }
    else {
      local_50 = (long *)param->overflow_arg_area;
      param->overflow_arg_area = local_50 + 1;
    }
    CVar2 = setopt_long(data,option,*local_50);
    return CVar2;
  }
  if (19999 < option) {
    if (option < 30000) {
      CVar2 = setopt_func(data,option,param);
      return CVar2;
    }
    if (option < 40000) {
      uVar1 = param->gp_offset;
      if (uVar1 < 0x29) {
        local_c8 = (curl_off_t *)((long)(int)uVar1 + (long)param->reg_save_area);
        param->gp_offset = uVar1 + 8;
      }
      else {
        local_c8 = (curl_off_t *)param->overflow_arg_area;
        param->overflow_arg_area = local_c8 + 1;
      }
      CVar2 = setopt_offt(data,option,*local_c8);
      return CVar2;
    }
    uVar1 = param->gp_offset;
    if (uVar1 < 0x29) {
      local_f0 = (undefined8 *)((long)(int)uVar1 + (long)param->reg_save_area);
      param->gp_offset = uVar1 + 8;
    }
    else {
      local_f0 = (undefined8 *)param->overflow_arg_area;
      param->overflow_arg_area = local_f0 + 1;
    }
    CVar2 = setopt_blob(data,option,(curl_blob *)*local_f0);
    return CVar2;
  }
  if (option == CURLOPT_HTTPHEADER) {
LAB_001804b0:
    uVar1 = param->gp_offset;
    if (uVar1 < 0x29) {
      local_78 = (undefined8 *)((long)(int)uVar1 + (long)param->reg_save_area);
      param->gp_offset = uVar1 + 8;
    }
    else {
      local_78 = (undefined8 *)param->overflow_arg_area;
      param->overflow_arg_area = local_78 + 1;
    }
    data_local._4_4_ = setopt_slist(data,option,(curl_slist *)*local_78);
  }
  else {
    if (option != CURLOPT_HTTPPOST) {
      if (option == CURLOPT_QUOTE) goto LAB_001804b0;
      if (option != CURLOPT_STDERR) {
        if (((option == CURLOPT_POSTQUOTE) || (option == CURLOPT_TELNETOPTIONS)) ||
           (option == CURLOPT_PREQUOTE)) goto LAB_001804b0;
        if (option != CURLOPT_SHARE) {
          if (((option == CURLOPT_HTTP200ALIASES) || (option == CURLOPT_MAIL_RCPT)) ||
             ((option == CURLOPT_RESOLVE || (option == CURLOPT_PROXYHEADER)))) goto LAB_001804b0;
          if (1 < option - CURLOPT_STREAM_DEPENDS) {
            if (option == CURLOPT_CONNECT_TO) goto LAB_001804b0;
            if (option != CURLOPT_MIMEPOST) {
              uVar1 = param->gp_offset;
              if (uVar1 < 0x29) {
                local_a0 = (undefined8 *)((long)(int)uVar1 + (long)param->reg_save_area);
                param->gp_offset = uVar1 + 8;
              }
              else {
                local_a0 = (undefined8 *)param->overflow_arg_area;
                param->overflow_arg_area = local_a0 + 1;
              }
              CVar2 = setopt_cptr(data,option,(char *)*local_a0);
              return CVar2;
            }
          }
        }
      }
    }
    data_local._4_4_ = setopt_pointers(data,option,param);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_vsetopt(struct Curl_easy *data, CURLoption option, va_list param)
{
  if(option < CURLOPTTYPE_OBJECTPOINT)
    return setopt_long(data, option, va_arg(param, long));
  else if(option < CURLOPTTYPE_FUNCTIONPOINT) {
    /* unfortunately, different pointer types cannot be identified any other
       way than being listed explicitly */
    switch(option) {
    case CURLOPT_HTTPHEADER:
    case CURLOPT_QUOTE:
    case CURLOPT_POSTQUOTE:
    case CURLOPT_TELNETOPTIONS:
    case CURLOPT_PREQUOTE:
    case CURLOPT_HTTP200ALIASES:
    case CURLOPT_MAIL_RCPT:
    case CURLOPT_RESOLVE:
    case CURLOPT_PROXYHEADER:
    case CURLOPT_CONNECT_TO:
      return setopt_slist(data, option, va_arg(param, struct curl_slist *));
    case CURLOPT_HTTPPOST:         /* curl_httppost * */
    case CURLOPT_MIMEPOST:         /* curl_mime * */
    case CURLOPT_STDERR:           /* FILE * */
    case CURLOPT_SHARE:            /* CURLSH * */
    case CURLOPT_STREAM_DEPENDS:   /* CURL * */
    case CURLOPT_STREAM_DEPENDS_E: /* CURL * */
      return setopt_pointers(data, option, param);
    default:
      break;
    }
    /* the char pointer options */
    return setopt_cptr(data, option, va_arg(param, char *));
  }
  else if(option < CURLOPTTYPE_OFF_T)
    return setopt_func(data, option, param);
  else if(option < CURLOPTTYPE_BLOB)
    return setopt_offt(data, option, va_arg(param, curl_off_t));
  return setopt_blob(data, option, va_arg(param, struct curl_blob *));
}